

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this_00;
  ImU32 col_00;
  int iVar8;
  ImPlotContext *pIVar9;
  double dVar10;
  undefined4 in_XMM1_Da;
  float fVar11;
  float fVar12;
  undefined4 in_XMM1_Db;
  double dVar13;
  float fVar14;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  double local_88;
  ImDrawList *local_70;
  ImVec2 local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar9 = GImPlot;
  col_00 = (ImU32)DrawList;
  local_70 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar3 = *(int *)(this + 0x10);
    local_48 = iVar3 + -1;
    local_40 = line_weight * 0.5;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = col_00;
    local_88 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                         (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3
                                         & 0xffffffff);
    pIVar7 = GImPlot;
    dVar5 = log10((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) /
                  GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
    iVar3 = *(int *)&getter->Getter;
    pIVar4 = pIVar7->CurrentPlot;
    dVar10 = pIVar4->YAxis[iVar3].Range.Min;
    IVar2 = pIVar7->PixelRange[iVar3].Min;
    local_3c.y = (float)(pIVar7->My[iVar3] *
                         (((double)(float)(dVar5 / pIVar7->LogDenY[iVar3]) *
                           (pIVar4->YAxis[iVar3].Range.Max - dVar10) + dVar10) - dVar10) +
                        (double)IVar2.y);
    local_3c.x = (float)(pIVar7->Mx * (local_88 - (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLog> *)local_58,local_70
               ,&pIVar9->CurrentPlot->PlotRect);
  }
  else {
    iVar3 = *(int *)(this + 0x10);
    local_88 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                         (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3
                                         & 0xffffffff);
    pIVar7 = GImPlot;
    dVar5 = log10((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) /
                  GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
    iVar3 = *(int *)&getter->Getter;
    pIVar4 = pIVar7->CurrentPlot;
    dVar10 = pIVar4->YAxis[iVar3].Range.Min;
    IVar2 = pIVar7->PixelRange[iVar3].Min;
    dVar13 = pIVar7->Mx * (local_88 - (pIVar4->XAxis).Range.Min) + (double)IVar2.x;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar3] *
                 (((double)(float)(dVar5 / pIVar7->LogDenY[iVar3]) *
                   (pIVar4->YAxis[iVar3].Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar2.y);
    local_58._0_4_ = (float)dVar13;
    iVar3 = *(int *)(this + 0x10);
    if (1 < iVar3) {
      iVar8 = 1;
      local_60 = pIVar9;
      do {
        dVar10 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                           (long)((*(int *)(this + 0x14) + iVar8) % iVar3 + iVar3) %
                                           (long)iVar3 & 0xffffffff);
        pIVar7 = GImPlot;
        local_88 = dVar10;
        dVar5 = log10(dVar13 / GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
        this_00 = local_70;
        iVar3 = *(int *)&getter->Getter;
        pIVar4 = pIVar7->CurrentPlot;
        dVar10 = pIVar4->YAxis[iVar3].Range.Min;
        IVar2 = pIVar7->PixelRange[iVar3].Min;
        fVar11 = (float)(pIVar7->Mx * (local_88 - (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
        fVar14 = (float)(pIVar7->My[iVar3] *
                         (((double)(float)(dVar5 / pIVar7->LogDenY[iVar3]) *
                           (pIVar4->YAxis[iVar3].Range.Max - dVar10) + dVar10) - dVar10) +
                        (double)IVar2.y);
        local_68.y = fVar14;
        local_68.x = fVar11;
        pIVar4 = pIVar9->CurrentPlot;
        fVar6 = (float)local_58._4_4_;
        if (fVar14 <= (float)local_58._4_4_) {
          fVar6 = fVar14;
        }
        fVar12 = fVar14;
        if ((fVar6 < (pIVar4->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar14 <= (float)local_58._4_4_) & (uint)fVar14 |
                           -(uint)(fVar14 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar14 = 0.0;
          fVar6 = (float)local_58._0_4_;
          if (fVar11 <= (float)local_58._0_4_) {
            fVar6 = fVar11;
          }
          fVar12 = (float)local_58._0_4_;
          if ((fVar6 < (pIVar4->PlotRect).Max.x) &&
             (fVar6 = (float)(-(uint)(fVar11 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar11 <= (float)local_58._0_4_) & (uint)fVar11),
             (pIVar4->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar4->PlotRect).Min.x)) {
            local_90.y = (float)local_58._4_4_;
            local_90.x = fVar11;
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_90,col_00,line_weight);
            pIVar9 = local_60;
            ImDrawList::AddLine(this_00,&local_90,&local_68,col_00,line_weight);
          }
        }
        dVar13 = (double)CONCAT44(fVar14,fVar12);
        iVar8 = iVar8 + 1;
        iVar3 = *(int *)(this + 0x10);
        local_58 = (undefined1  [8])local_68;
      } while (iVar8 < iVar3);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}